

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O3

void unzip(char *fn)

{
  char cVar1;
  short extraout_AX;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar4;
  int iVar5;
  archive *a;
  la_ssize_t lVar6;
  la_int64_t lVar7;
  archive_entry *paVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  char *path;
  archive_entry *paVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  archive_entry *e;
  size_t alen;
  stat sb;
  archive_entry *local_130;
  archive_entry *local_128;
  archive_entry *local_120;
  char *local_118;
  char *local_110;
  uint local_104;
  time_t local_100;
  char *local_f8;
  timespec local_e8;
  time_t local_d8;
  long local_d0;
  stat local_c0;
  
  a = archive_read_new();
  if (a == (archive *)0x0) goto LAB_00104c20;
  wVar2 = archive_read_support_format_zip(a);
  if ((wVar2 == L'\0') &&
     ((O_arg == (char *)0x0 ||
      (wVar2 = archive_read_set_format_option(a,"zip","hdrcharset",O_arg), wVar2 == L'\0')))) {
    if (P_arg == (char *)0x0) {
      archive_read_set_passphrase_callback(a,(void *)0x0,passphrase_callback);
    }
    else {
      archive_read_add_passphrase(a,P_arg);
    }
    wVar2 = archive_read_open_filename(a,fn,0x2000);
    if (wVar2 != L'\0') goto LAB_00104c07;
    if (zipinfo_mode == '\0') {
      if ((p_opt == '\0') && ((q_opt & 1) == 0)) {
        printf("Archive:  %s\n",fn);
      }
      if (v_opt == 1) {
        pcVar16 = " --------    %s----   ----    ----\n";
        pcVar13 = "  Length     %sDate   Time    Name\n";
      }
      else {
        if (v_opt != 2) goto LAB_001043ee;
        pcVar16 = "--------  ------  ------- -----   %s----   ----   ------    ----\n";
        pcVar13 = " Length   Method    Size  Ratio   %sDate   Time   CRC-32    Name\n";
      }
      printf(pcVar13,y_str);
      printf(pcVar16,y_str);
    }
LAB_001043ee:
    pcVar13 = (char *)0x0;
    lVar14 = 0;
    lVar15 = 0;
    local_f8 = fn;
    while (iVar3 = archive_read_next_header(a,&local_130), paVar12 = local_130, iVar3 == 0) {
      if (zipinfo_mode == '\0') {
        if (t_opt == '\x01') {
          mVar4 = archive_entry_filetype(local_130);
          if ((mVar4 & 0xf000) == 0x4000) {
            uVar17 = 0;
          }
          else {
            pcVar16 = archive_entry_pathname(paVar12);
            info("    testing: %s\t",pcVar16);
            do {
              lVar6 = archive_read_data(a,buffer,0x2000);
            } while (0 < lVar6);
            if (lVar6 < 0) {
              pcVar16 = archive_error_string(a);
              info(" %s\n",pcVar16);
            }
            else {
              info(" OK\n");
            }
            uVar17 = (ulong)(lVar6 < 0);
            iVar3 = archive_read_data_skip(a);
            if (iVar3 != 0) goto LAB_00104c07;
          }
          pcVar13 = pcVar13 + uVar17;
        }
        else {
          if (v_opt != 0) goto LAB_00104464;
          local_110 = pcVar13;
          if ((p_opt != '\0') || ((c_opt & 1) != 0)) {
            pcVar13 = archive_entry_pathname(local_130);
            pcVar13 = pathdup(pcVar13);
            if (pcVar13 == (char *)0x0) {
              warningx("skipping empty or unreadable filename entry");
              iVar3 = archive_read_data_skip(a);
              pcVar13 = local_110;
              goto LAB_0010499d;
            }
            mVar4 = archive_entry_filetype(paVar12);
            uVar11 = mVar4 & 0xf000;
            if (uVar11 == 0x4000) {
              iVar3 = archive_read_data_skip(a);
joined_r0x001046c5:
              if (iVar3 != 0) goto LAB_00104c07;
            }
            else {
              if ((uVar11 != 0x8000) && (uVar11 != 0xa000)) {
                warningx("skipping non-regular entry \'%s\'",pcVar13);
LAB_001049be:
                iVar3 = archive_read_data_skip(a);
                goto joined_r0x001046c5;
              }
              iVar3 = accept_pathname(pcVar13);
              if (iVar3 == 0) goto LAB_001049be;
              if (c_opt == 1) {
                info("x %s\n",pcVar13);
              }
              extract2fd(a,pcVar13,1);
            }
LAB_00104a87:
            free(pcVar13);
            pcVar13 = local_110;
            goto LAB_001045e4;
          }
          pcVar16 = archive_entry_pathname(local_130);
          pcVar16 = pathdup(pcVar16);
          if (pcVar16 == (char *)0x0) {
            warningx("skipping empty or unreadable filename entry");
            iVar3 = archive_read_data_skip(a);
LAB_0010499d:
            if (iVar3 == 0) goto LAB_001045e4;
            goto LAB_00104c07;
          }
          local_118 = pcVar16;
          mVar4 = archive_entry_filetype(paVar12);
          if (*local_118 == '.') {
            if ((local_118[1] != '.') || (local_118[2] != '/')) goto LAB_00104609;
LAB_0010493a:
            pcVar13 = "skipping insecure entry \'%s\'";
LAB_00104941:
            pcVar16 = local_118;
            warningx(pcVar13,local_118);
            iVar3 = archive_read_data_skip(a);
          }
          else {
            if (*local_118 == '/') goto LAB_0010493a;
LAB_00104609:
            pcVar13 = strstr(local_118,"/../");
            if (pcVar13 != (char *)0x0) goto LAB_0010493a;
            uVar11 = mVar4 & 0xf000;
            if (((uVar11 != 0x4000) && (uVar11 != 0x8000)) && (uVar11 != 0xa000)) {
              pcVar13 = "skipping non-regular entry \'%s\'";
              goto LAB_00104941;
            }
            if (((uVar11 != 0x4000) || ((j_opt & 1) == 0)) &&
               (iVar3 = accept_pathname(local_118), iVar3 != 0)) {
              local_120 = paVar12;
              pcVar13 = local_118;
              pcVar16 = local_118;
              path = local_118;
              if (j_opt == 1) {
                do {
                  do {
                    path = pcVar16;
                    pcVar16 = pcVar13 + 1;
                    cVar1 = *pcVar13;
                    pcVar13 = pcVar16;
                  } while (cVar1 == '/');
                  pcVar16 = path;
                } while (cVar1 != '\0');
              }
              paVar8 = (archive_entry *)pathcat(d_arg,path);
              local_128 = paVar8;
              make_parent((char *)paVar8);
              paVar12 = local_120;
              if (uVar11 == 0x4000) {
                if (*(char *)&paVar8->archive != '\0') {
                  mVar4 = archive_entry_mode(local_120);
                  uVar11 = mVar4 & 0x1ff | 0x1c0;
                  if ((mVar4 & 0x1ff) == 0) {
                    uVar11 = 0x1ed;
                  }
                  info("   creating: %s/\n",paVar8);
                  local_120 = paVar8;
                  iVar3 = lstat((char *)paVar8,&local_c0);
                  if (iVar3 == 0) {
                    if ((local_c0.st_mode & 0xf000) != 0x4000) {
                      unlink((char *)local_120);
                      goto LAB_00104782;
                    }
                  }
                  else {
LAB_00104782:
                    iVar3 = mkdir((char *)local_120,uVar11 >> 2 & 9 | uVar11);
                    if ((iVar3 != 0) && (piVar9 = __errno_location(), *piVar9 != 0x11)) {
                      pcVar13 = "mkdir(\'%s\')";
                      paVar12 = local_120;
LAB_00104c74:
                      error(pcVar13,paVar12);
                    }
                  }
                  iVar3 = archive_read_data_skip(a);
                  paVar8 = local_120;
                  if (iVar3 != 0) goto LAB_00104c07;
                }
              }
              else {
                mVar4 = archive_entry_mode(local_120);
                local_104 = mVar4 & 0x1ff;
                if (local_104 == 0) {
                  local_104 = 0x1a4;
                }
                local_100 = archive_entry_mtime(paVar12);
                lVar10 = archive_entry_mtime_nsec(paVar12);
                iVar3 = lstat((char *)local_128,&local_c0);
                if (iVar3 == 0) {
                  do {
                    paVar8 = local_128;
                    if ((u_opt != '\0') || ((f_opt & 1) != 0)) {
                      if (((local_c0.st_mode & 0xf000) == 0x8000) &&
                         ((local_100 < local_c0.st_mtim.tv_sec ||
                          ((local_c0.st_mtim.tv_sec == local_100 &&
                           (lVar10 <= local_c0.st_mtim.tv_nsec)))))) goto LAB_00104a7d;
LAB_00104ad2:
                      unlink((char *)local_128);
                      goto LAB_0010481f;
                    }
                    if (o_opt == '\x01') goto LAB_00104ad2;
                    if (n_opt != '\0') goto LAB_00104a7d;
                    unzip_cold_1();
                  } while (extraout_AX == 2);
                  paVar8 = local_128;
                  if (extraout_AX == 0) goto LAB_00104a7d;
                  if (extraout_AX != 1) goto LAB_00104812;
                }
                else {
LAB_00104812:
                  paVar8 = local_128;
                  if (f_opt != 0) goto LAB_00104a7d;
                }
LAB_0010481f:
                local_e8.tv_sec = 0;
                local_e8.tv_nsec = 0x3fffffff;
                local_d8 = local_100;
                local_d0 = lVar10;
                pcVar13 = archive_entry_symlink(paVar12);
                if (pcVar13 == (char *)0x0) {
                  iVar3 = open((char *)local_128,0x242,(ulong)local_104);
                  if (iVar3 < 0) {
                    pcVar13 = "open(\'%s\')";
                    paVar12 = local_128;
                    goto LAB_00104c74;
                  }
                  info(" extracting: %s",local_128);
                  iVar5 = extract2fd(a,(char *)local_128,iVar3);
                  if (tty == '\x01') {
                    info("  \b\b");
                  }
                  if (iVar5 != 0) {
                    info(" (text)");
                  }
                  info("\n");
                  iVar5 = futimens(iVar3,&local_e8);
                  if (iVar5 != 0) {
                    pcVar13 = "futimens(\'%s\')";
                    paVar12 = local_128;
                    goto LAB_00104c74;
                  }
                  iVar3 = close(iVar3);
                  paVar8 = local_128;
                  if (iVar3 != 0) {
                    pcVar13 = "close(\'%s\')";
                    paVar12 = local_128;
                    goto LAB_00104c74;
                  }
                }
                else {
                  iVar3 = symlink(pcVar13,(char *)local_128);
                  if (iVar3 != 0) {
                    pcVar13 = "symlink(\'%s\')";
                    paVar12 = local_128;
                    goto LAB_00104c74;
                  }
                  info(" extracting: %s -> %s\n",local_128,pcVar13);
                  iVar3 = lchmod((char *)local_128,local_104);
                  if (iVar3 != 0) {
                    warning("Cannot set mode for \'%s\'",local_128);
                  }
                  iVar3 = utimensat(-100,(char *)local_128,&local_e8,0x100);
                  paVar8 = local_128;
                  if (iVar3 != 0) {
                    warning("utimensat(\'%s\')",local_128);
                    paVar8 = local_128;
                  }
                }
              }
LAB_00104a7d:
              free(paVar8);
              pcVar13 = local_118;
              goto LAB_00104a87;
            }
            iVar3 = archive_read_data_skip(a);
            pcVar16 = local_118;
          }
          if (iVar3 != 0) goto LAB_00104c07;
          free(pcVar16);
          pcVar13 = local_110;
        }
      }
      else if (Z1_opt == '\x01') {
LAB_00104464:
        list(a,local_130);
      }
LAB_001045e4:
      lVar7 = archive_entry_size(local_130);
      lVar15 = lVar15 + lVar7;
      lVar14 = lVar14 + 1;
    }
    if (iVar3 != 1) goto LAB_00104c07;
    if (zipinfo_mode == '\x01') {
      if (v_opt == 2) {
        printf("--------          -------  ---                            %s-------\n",y_str);
        pcVar16 = "s";
        if (lVar14 == 1) {
          pcVar16 = "";
        }
        printf("%8ju          %7ju   0%%                            %s%ju file%s\n",lVar15,lVar15,
               y_str,lVar14,pcVar16);
      }
      else if (v_opt == 1) {
        printf(" --------                   %s-------\n",y_str);
        pcVar16 = "s";
        if (lVar14 == 1) {
          pcVar16 = "";
        }
        printf(" %8ju                   %s%ju file%s\n",lVar15,y_str,lVar14,pcVar16);
      }
    }
    iVar3 = archive_read_free(a);
    pcVar16 = local_f8;
    if (iVar3 != 0) goto LAB_00104c07;
    if (passphrase_buf != (char *)0x0) {
      free(passphrase_buf);
    }
    if (t_opt != '\x01') {
      return;
    }
    if (pcVar13 == (char *)0x0) {
      printf("No errors detected in compressed data of %s.\n",pcVar16);
      return;
    }
    pcVar16 = "%ju checksum error(s) found.";
  }
  else {
LAB_00104c07:
    pcVar13 = archive_error_string(a);
    pcVar16 = "%s";
  }
  errorx(pcVar16,pcVar13);
LAB_00104c20:
  error("archive_read_new failed");
}

Assistant:

static void
unzip(const char *fn)
{
	struct archive *a;
	struct archive_entry *e;
	int ret;
	uintmax_t total_size, file_count, error_count;

	if ((a = archive_read_new()) == NULL)
		error("archive_read_new failed");

	ac(archive_read_support_format_zip(a));

	if (O_arg)
		ac(archive_read_set_format_option(a, "zip", "hdrcharset", O_arg));

	if (P_arg)
		archive_read_add_passphrase(a, P_arg);
	else
		archive_read_set_passphrase_callback(a, NULL,
			&passphrase_callback);

	ac(archive_read_open_filename(a, fn, 8192));

	if (!zipinfo_mode) {
		if (!p_opt && !q_opt)
			printf("Archive:  %s\n", fn);
		if (v_opt == 1) {
			printf("  Length     %sDate   Time    Name\n", y_str);
			printf(" --------    %s----   ----    ----\n", y_str);
		} else if (v_opt == 2) {
			printf(" Length   Method    Size  Ratio   %sDate   Time   CRC-32    Name\n", y_str);
			printf("--------  ------  ------- -----   %s----   ----   ------    ----\n", y_str);
		}
	}

	total_size = 0;
	file_count = 0;
	error_count = 0;
	for (;;) {
		ret = archive_read_next_header(a, &e);
		if (ret == ARCHIVE_EOF)
			break;
		ac(ret);
		if (!zipinfo_mode) {
			if (t_opt)
				error_count += test(a, e);
			else if (v_opt)
				list(a, e);
			else if (p_opt || c_opt)
				extract_stdout(a, e);
			else
				extract(a, e);
		} else {
			if (Z1_opt)
				list(a, e);
		}

		total_size += archive_entry_size(e);
		++file_count;
	}

	if (zipinfo_mode) {
		if (v_opt == 1) {
			printf(" --------                   %s-------\n", y_str);
			printf(" %8ju                   %s%ju file%s\n",
			    total_size, y_str, file_count, file_count != 1 ? "s" : "");
		} else if (v_opt == 2) {
			printf("--------          -------  ---                            %s-------\n", y_str);
			printf("%8ju          %7ju   0%%                            %s%ju file%s\n",
			    total_size, total_size, y_str, file_count,
			    file_count != 1 ? "s" : "");
		}
	}

	ac(archive_read_free(a));

	if (passphrase_buf != NULL) {
		memset(passphrase_buf, 0, PPBUFF_SIZE);
		free(passphrase_buf);
	}

	if (t_opt) {
		if (error_count > 0) {
			errorx("%ju checksum error(s) found.", error_count);
		}
		else {
			printf("No errors detected in compressed data of %s.\n",
			       fn);
		}
	}
}